

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_miniz.h
# Opt level: O3

tinfl_status
tinfl_decompress(tinfl_decompressor *r,mz_uint8 *pIn_buf_next,size_t *pIn_buf_size,
                mz_uint8 *pOut_buf_start,mz_uint8 *pOut_buf_next,size_t *pOut_buf_size,
                mz_uint32 decomp_flags)

{
  uint *puVar1;
  short sVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  bool bVar8;
  tinfl_huff_table *ptVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  byte bVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  mz_uint8 *pmVar19;
  uint uVar20;
  uint uVar21;
  mz_uint8 *pmVar22;
  mz_uint8 *pmVar23;
  char cVar24;
  ulong uVar25;
  size_t buf_len;
  ulong uVar26;
  mz_uint8 *pmVar27;
  char cVar28;
  ulong uVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  ushort uVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  uint uVar44;
  long lVar45;
  uint uVar46;
  ulong uVar47;
  mz_int16 *__s;
  bool bVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar67 [16];
  mz_uint total_syms [16];
  mz_uint next_code [17];
  tinfl_status local_16c;
  uint local_15c;
  mz_uint8 *local_150;
  ulong local_148;
  uint *local_140;
  ulong local_120;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined8 local_78;
  int aiStack_70 [16];
  
  if (pOut_buf_next < pOut_buf_start) {
LAB_001169d4:
    *pOut_buf_size = 0;
    *pIn_buf_size = 0;
    return TINFL_STATUS_BAD_PARAM;
  }
  pmVar22 = pOut_buf_next + *pOut_buf_size;
  uVar26 = -(ulong)((decomp_flags & 4) != 0) | (ulong)(pmVar22 + ~(ulong)pOut_buf_start);
  if ((uVar26 + 1 & uVar26) != 0) goto LAB_001169d4;
  uVar20 = r->m_state;
  uVar30 = r->m_num_bits;
  uVar18 = r->m_bit_buf;
  uVar21 = r->m_dist;
  local_148 = (ulong)uVar21;
  uVar17 = r->m_counter;
  uVar25 = (ulong)uVar17;
  local_15c = r->m_num_extra;
  local_120 = r->m_dist_from_out_buf_start;
  local_16c = TINFL_STATUS_FAILED;
  cVar24 = '\0';
  local_150 = pOut_buf_next;
  local_140 = (uint *)pIn_buf_next;
  if (0x35 < uVar20) {
switchD_00116849_caseD_4:
    cVar28 = '\0';
    goto LAB_00116854;
  }
  sVar3 = *pIn_buf_size;
  puVar1 = (uint *)(pIn_buf_next + sVar3);
  switch(uVar20) {
  case 0:
    r->m_zhdr1 = 0;
    r->m_z_adler32 = 1;
    r->m_zhdr0 = 0;
    r->m_check_adler32 = 1;
    if ((decomp_flags & 1) != 0) {
      if ((long)sVar3 < 1) {
        uVar18 = 0;
        local_15c = 0;
        uVar17 = 0;
        local_148 = 0;
        uVar30 = 0;
        goto LAB_00116e04;
      }
      local_140 = (uint *)(pIn_buf_next + 1);
      r->m_zhdr0 = (uint)*pIn_buf_next;
      uVar18 = 0;
      local_15c = 0;
      uVar17 = 0;
      local_148 = 0;
      uVar30 = 0;
      goto LAB_00116e1b;
    }
    uVar18 = 0;
    local_15c = 0;
    local_148 = 0;
    uVar30 = 0;
LAB_00116eba:
    uVar35 = 0;
    goto joined_r0x00117134;
  case 1:
    if (0 < (long)sVar3) {
      r->m_zhdr0 = (uint)*pIn_buf_next;
      local_140 = (uint *)(pIn_buf_next + 1);
LAB_00116e1b:
      if (local_140 < puVar1) goto LAB_00116b8b;
LAB_00116e26:
      uVar20 = 0;
      if ((decomp_flags & 2) != 0) {
        uVar20 = 2;
        goto LAB_00116f39;
      }
      goto LAB_00116e37;
    }
LAB_00116e04:
    if ((decomp_flags & 2) == 0) {
      r->m_zhdr0 = 0;
      goto LAB_00116e1b;
    }
    cVar24 = '\x01';
    uVar20 = 1;
    uVar29 = 0;
    local_16c = TINFL_STATUS_NEEDS_MORE_INPUT;
    break;
  case 2:
    if ((long)sVar3 < 1) goto LAB_00116e26;
LAB_00116b8b:
    uVar20 = (uint)(byte)*local_140;
    local_140 = (uint *)((long)local_140 + 1);
LAB_00116e37:
    uVar21 = r->m_zhdr0;
    bVar48 = (uVar21 & 0xf) != 8;
    bVar7 = (uVar20 & 0x20) != 0;
    bVar8 = (uVar21 << 8 | uVar20) % 0x1f != 0;
    r->m_zhdr1 = uVar20;
    if ((decomp_flags & 4) == 0) {
      uVar25 = 0x100L << ((byte)(uVar21 >> 4) & 0x3f);
      if ((uVar26 + 1 < uVar25 || 0x8000 < (uint)uVar25) || (bVar48 || (bVar7 || bVar8)))
      goto LAB_00116ed0;
      goto LAB_00116eba;
    }
    uVar35 = 0;
    if (bVar48 || (bVar7 || bVar8)) {
LAB_00116ed0:
      uVar17 = 1;
      uVar20 = 0x24;
      goto switchD_00116849_caseD_a;
    }
joined_r0x00117134:
    do {
      for (; uVar30 < 3; uVar30 = uVar30 + 8) {
        uVar25 = uVar35;
        if (local_140 < puVar1) {
LAB_00116bed:
          uVar35 = (ulong)(byte)*local_140;
          local_140 = (uint *)((long)local_140 + 1);
        }
        else {
LAB_00117360:
          uVar17 = (uint)uVar25;
          uVar35 = 0;
          uVar29 = 0;
          if ((decomp_flags & 2) != 0) {
            local_16c = TINFL_STATUS_NEEDS_MORE_INPUT;
            cVar24 = '\x01';
            uVar20 = 3;
            goto LAB_00116851;
          }
        }
        uVar18 = uVar18 | uVar35 << ((byte)uVar30 & 0x3f);
        uVar35 = uVar25;
      }
      uVar17 = (uint)uVar35;
      uVar21 = (uint)uVar18 & 7;
      r->m_final = uVar21;
      uVar18 = uVar18 >> 3;
      uVar30 = uVar30 - 3;
      uVar20 = uVar21 >> 1;
      r->m_type = uVar20;
      if (uVar21 < 2) {
LAB_00117158:
        uVar18 = uVar18 >> ((byte)uVar30 & 7);
        uVar30 = uVar30 & 0xfffffff8;
        uVar25 = 0;
        while (uVar17 = (uint)uVar25, uVar17 < 4) {
          if (uVar30 == 0) {
            uVar30 = 0;
            if (local_140 < puVar1) {
              uVar20 = *local_140;
              local_140 = (uint *)((long)local_140 + 1);
              r->m_raw_header[uVar25] = (byte)uVar20;
              uVar30 = 0;
            }
            else {
LAB_001172bd:
              uVar17 = (uint)uVar25;
              if ((decomp_flags & 2) != 0) {
                local_16c = TINFL_STATUS_NEEDS_MORE_INPUT;
                uVar25 = 1;
                uVar20 = 7;
                goto LAB_0011684f;
              }
              r->m_raw_header[uVar25] = '\0';
            }
          }
          else {
            uVar20 = uVar30;
            if (uVar30 < 8) {
              do {
                if (local_140 < puVar1) {
                  uVar20 = *local_140;
                  local_140 = (uint *)((long)local_140 + 1);
                  uVar18 = uVar18 | (ulong)(byte)uVar20 << ((byte)uVar30 & 0x3f);
                  uVar20 = uVar30 + 8;
                  break;
                }
LAB_00117305:
                uVar17 = (uint)uVar25;
                uVar29 = 0;
                if ((decomp_flags & 2) != 0) {
                  local_16c = TINFL_STATUS_NEEDS_MORE_INPUT;
                  cVar24 = '\x01';
                  uVar20 = 6;
                  goto LAB_00116851;
                }
LAB_00117312:
                uVar18 = uVar18 | uVar29 << ((byte)uVar30 & 0x3f);
                uVar20 = uVar30 + 8;
                bVar48 = 0xfffffff7 < uVar30;
                uVar30 = uVar20;
              } while (bVar48);
            }
            uVar17 = (uint)uVar25;
            r->m_raw_header[uVar25] = (mz_uint8)uVar18;
            uVar18 = uVar18 >> 8;
            uVar30 = uVar20 - 8;
          }
LAB_0011733b:
          uVar25 = (ulong)(uVar17 + 1);
        }
        uVar39 = *(ushort *)r->m_raw_header;
        uVar25 = (ulong)uVar39;
        uVar17 = (uint)uVar39;
        if ((*(ushort *)(r->m_raw_header + 2) ^ uVar39) != 0xffff) {
          uVar20 = 0x27;
LAB_0011739a:
          uVar25 = 0;
          goto LAB_0011684f;
        }
        while ((uVar17 = (uint)uVar25, uVar17 != 0 && (uVar30 != 0))) {
          uVar20 = uVar30;
          if (uVar30 < 8) {
            do {
              uVar17 = (uint)uVar25;
              if (local_140 < puVar1) {
                uVar20 = *local_140;
                local_140 = (uint *)((long)local_140 + 1);
                uVar18 = uVar18 | (ulong)(byte)uVar20 << ((byte)uVar30 & 0x3f);
                uVar20 = uVar30 + 8;
                break;
              }
LAB_001173de:
              uVar17 = (uint)uVar25;
              uVar35 = 0;
              uVar29 = 0;
              if ((decomp_flags & 2) != 0) {
                local_16c = TINFL_STATUS_NEEDS_MORE_INPUT;
                cVar24 = '\x01';
                uVar20 = 0x33;
                goto LAB_00116851;
              }
LAB_001173eb:
              uVar17 = (uint)uVar25;
              uVar18 = uVar18 | uVar35 << ((byte)uVar30 & 0x3f);
              uVar20 = uVar30 + 8;
              bVar48 = 0xfffffff7 < uVar30;
              uVar30 = uVar20;
            } while (bVar48);
          }
          local_148 = uVar18 & 0xff;
          uVar18 = uVar18 >> 8;
          uVar30 = uVar20 - 8;
LAB_0011740d:
          if (pmVar22 <= local_150) {
            local_16c = TINFL_STATUS_HAS_MORE_OUTPUT;
            uVar25 = 1;
            uVar20 = 0x34;
            goto LAB_0011684f;
          }
          *local_150 = (mz_uint8)local_148;
          local_150 = local_150 + 1;
          uVar25 = (ulong)(uVar17 - 1);
        }
        while ((int)uVar25 != 0) {
LAB_0011744a:
          uVar17 = (uint)uVar25;
          if (pmVar22 <= local_150) {
            local_16c = TINFL_STATUS_HAS_MORE_OUTPUT;
            uVar25 = 1;
            uVar20 = 9;
            goto LAB_0011684f;
          }
LAB_0011745a:
          uVar17 = (uint)uVar25;
          if (puVar1 <= local_140) {
            if ((decomp_flags & 2) == 0) {
              uVar20 = 0x28;
              goto LAB_0011739a;
            }
            local_16c = TINFL_STATUS_NEEDS_MORE_INPUT;
            uVar25 = 1;
            uVar20 = 0x26;
            goto LAB_0011684f;
          }
          uVar35 = (long)puVar1 - (long)local_140;
          if ((ulong)((long)pmVar22 - (long)local_150) < (ulong)((long)puVar1 - (long)local_140)) {
            uVar35 = (long)pmVar22 - (long)local_150;
          }
          if (uVar25 <= uVar35) {
            uVar35 = uVar25;
          }
          memcpy(local_150,local_140,uVar35);
          local_140 = (uint *)((long)local_140 + uVar35);
          local_150 = local_150 + uVar35;
          uVar25 = (ulong)(uVar17 - (int)uVar35);
        }
        uVar35 = 0;
      }
      else {
        if (uVar20 == 1) {
          r->m_table_sizes[0] = 0x120;
          r->m_table_sizes[1] = 0x20;
          r->m_tables[1].m_code_size[0] = '\x05';
          r->m_tables[1].m_code_size[1] = '\x05';
          r->m_tables[1].m_code_size[2] = '\x05';
          r->m_tables[1].m_code_size[3] = '\x05';
          r->m_tables[1].m_code_size[4] = '\x05';
          r->m_tables[1].m_code_size[5] = '\x05';
          r->m_tables[1].m_code_size[6] = '\x05';
          r->m_tables[1].m_code_size[7] = '\x05';
          ptVar9 = r->m_tables;
          ptVar9[1].m_code_size[8] = '\x05';
          ptVar9[1].m_code_size[9] = '\x05';
          ptVar9[1].m_code_size[10] = '\x05';
          ptVar9[1].m_code_size[0xb] = '\x05';
          ptVar9[1].m_code_size[0xc] = '\x05';
          ptVar9[1].m_code_size[0xd] = '\x05';
          ptVar9[1].m_code_size[0xe] = '\x05';
          ptVar9[1].m_code_size[0xf] = '\x05';
          ptVar9 = r->m_tables;
          ptVar9[1].m_code_size[0x10] = '\x05';
          ptVar9[1].m_code_size[0x11] = '\x05';
          ptVar9[1].m_code_size[0x12] = '\x05';
          ptVar9[1].m_code_size[0x13] = '\x05';
          ptVar9[1].m_code_size[0x14] = '\x05';
          ptVar9[1].m_code_size[0x15] = '\x05';
          ptVar9[1].m_code_size[0x16] = '\x05';
          ptVar9[1].m_code_size[0x17] = '\x05';
          ptVar9 = r->m_tables;
          ptVar9[1].m_code_size[0x18] = '\x05';
          ptVar9[1].m_code_size[0x19] = '\x05';
          ptVar9[1].m_code_size[0x1a] = '\x05';
          ptVar9[1].m_code_size[0x1b] = '\x05';
          ptVar9[1].m_code_size[0x1c] = '\x05';
          ptVar9[1].m_code_size[0x1d] = '\x05';
          ptVar9[1].m_code_size[0x1e] = '\x05';
          ptVar9[1].m_code_size[0x1f] = '\x05';
          memset(r->m_tables,8,0x90);
          r->m_tables[0].m_code_size[0x90] = '\t';
          r->m_tables[0].m_code_size[0x91] = '\t';
          r->m_tables[0].m_code_size[0x92] = '\t';
          r->m_tables[0].m_code_size[0x93] = '\t';
          r->m_tables[0].m_code_size[0x94] = '\t';
          r->m_tables[0].m_code_size[0x95] = '\t';
          r->m_tables[0].m_code_size[0x96] = '\t';
          r->m_tables[0].m_code_size[0x97] = '\t';
          r->m_tables[0].m_code_size[0x98] = '\t';
          r->m_tables[0].m_code_size[0x99] = '\t';
          r->m_tables[0].m_code_size[0x9a] = '\t';
          r->m_tables[0].m_code_size[0x9b] = '\t';
          r->m_tables[0].m_code_size[0x9c] = '\t';
          r->m_tables[0].m_code_size[0x9d] = '\t';
          r->m_tables[0].m_code_size[0x9e] = '\t';
          r->m_tables[0].m_code_size[0x9f] = '\t';
          r->m_tables[0].m_code_size[0xa0] = '\t';
          r->m_tables[0].m_code_size[0xa1] = '\t';
          r->m_tables[0].m_code_size[0xa2] = '\t';
          r->m_tables[0].m_code_size[0xa3] = '\t';
          r->m_tables[0].m_code_size[0xa4] = '\t';
          r->m_tables[0].m_code_size[0xa5] = '\t';
          r->m_tables[0].m_code_size[0xa6] = '\t';
          r->m_tables[0].m_code_size[0xa7] = '\t';
          r->m_tables[0].m_code_size[0xa8] = '\t';
          r->m_tables[0].m_code_size[0xa9] = '\t';
          r->m_tables[0].m_code_size[0xaa] = '\t';
          r->m_tables[0].m_code_size[0xab] = '\t';
          r->m_tables[0].m_code_size[0xac] = '\t';
          r->m_tables[0].m_code_size[0xad] = '\t';
          r->m_tables[0].m_code_size[0xae] = '\t';
          r->m_tables[0].m_code_size[0xaf] = '\t';
          r->m_tables[0].m_code_size[0xb0] = '\t';
          r->m_tables[0].m_code_size[0xb1] = '\t';
          r->m_tables[0].m_code_size[0xb2] = '\t';
          r->m_tables[0].m_code_size[0xb3] = '\t';
          r->m_tables[0].m_code_size[0xb4] = '\t';
          r->m_tables[0].m_code_size[0xb5] = '\t';
          r->m_tables[0].m_code_size[0xb6] = '\t';
          r->m_tables[0].m_code_size[0xb7] = '\t';
          r->m_tables[0].m_code_size[0xb8] = '\t';
          r->m_tables[0].m_code_size[0xb9] = '\t';
          r->m_tables[0].m_code_size[0xba] = '\t';
          r->m_tables[0].m_code_size[0xbb] = '\t';
          r->m_tables[0].m_code_size[0xbc] = '\t';
          r->m_tables[0].m_code_size[0xbd] = '\t';
          r->m_tables[0].m_code_size[0xbe] = '\t';
          r->m_tables[0].m_code_size[0xbf] = '\t';
          r->m_tables[0].m_code_size[0xc0] = '\t';
          r->m_tables[0].m_code_size[0xc1] = '\t';
          r->m_tables[0].m_code_size[0xc2] = '\t';
          r->m_tables[0].m_code_size[0xc3] = '\t';
          r->m_tables[0].m_code_size[0xc4] = '\t';
          r->m_tables[0].m_code_size[0xc5] = '\t';
          r->m_tables[0].m_code_size[0xc6] = '\t';
          r->m_tables[0].m_code_size[199] = '\t';
          r->m_tables[0].m_code_size[200] = '\t';
          r->m_tables[0].m_code_size[0xc9] = '\t';
          r->m_tables[0].m_code_size[0xca] = '\t';
          r->m_tables[0].m_code_size[0xcb] = '\t';
          r->m_tables[0].m_code_size[0xcc] = '\t';
          r->m_tables[0].m_code_size[0xcd] = '\t';
          r->m_tables[0].m_code_size[0xce] = '\t';
          r->m_tables[0].m_code_size[0xcf] = '\t';
          r->m_tables[0].m_code_size[0xd0] = '\t';
          r->m_tables[0].m_code_size[0xd1] = '\t';
          r->m_tables[0].m_code_size[0xd2] = '\t';
          r->m_tables[0].m_code_size[0xd3] = '\t';
          r->m_tables[0].m_code_size[0xd4] = '\t';
          r->m_tables[0].m_code_size[0xd5] = '\t';
          r->m_tables[0].m_code_size[0xd6] = '\t';
          r->m_tables[0].m_code_size[0xd7] = '\t';
          r->m_tables[0].m_code_size[0xd8] = '\t';
          r->m_tables[0].m_code_size[0xd9] = '\t';
          r->m_tables[0].m_code_size[0xda] = '\t';
          r->m_tables[0].m_code_size[0xdb] = '\t';
          r->m_tables[0].m_code_size[0xdc] = '\t';
          r->m_tables[0].m_code_size[0xdd] = '\t';
          r->m_tables[0].m_code_size[0xde] = '\t';
          r->m_tables[0].m_code_size[0xdf] = '\t';
          r->m_tables[0].m_code_size[0xe0] = '\t';
          r->m_tables[0].m_code_size[0xe1] = '\t';
          r->m_tables[0].m_code_size[0xe2] = '\t';
          r->m_tables[0].m_code_size[0xe3] = '\t';
          r->m_tables[0].m_code_size[0xe4] = '\t';
          r->m_tables[0].m_code_size[0xe5] = '\t';
          r->m_tables[0].m_code_size[0xe6] = '\t';
          r->m_tables[0].m_code_size[0xe7] = '\t';
          r->m_tables[0].m_code_size[0xe8] = '\t';
          r->m_tables[0].m_code_size[0xe9] = '\t';
          r->m_tables[0].m_code_size[0xea] = '\t';
          r->m_tables[0].m_code_size[0xeb] = '\t';
          r->m_tables[0].m_code_size[0xec] = '\t';
          r->m_tables[0].m_code_size[0xed] = '\t';
          r->m_tables[0].m_code_size[0xee] = '\t';
          r->m_tables[0].m_code_size[0xef] = '\t';
          r->m_tables[0].m_code_size[0xf0] = '\t';
          r->m_tables[0].m_code_size[0xf1] = '\t';
          r->m_tables[0].m_code_size[0xf2] = '\t';
          r->m_tables[0].m_code_size[0xf3] = '\t';
          r->m_tables[0].m_code_size[0xf4] = '\t';
          r->m_tables[0].m_code_size[0xf5] = '\t';
          r->m_tables[0].m_code_size[0xf6] = '\t';
          r->m_tables[0].m_code_size[0xf7] = '\t';
          r->m_tables[0].m_code_size[0xf8] = '\t';
          r->m_tables[0].m_code_size[0xf9] = '\t';
          r->m_tables[0].m_code_size[0xfa] = '\t';
          r->m_tables[0].m_code_size[0xfb] = '\t';
          r->m_tables[0].m_code_size[0xfc] = '\t';
          r->m_tables[0].m_code_size[0xfd] = '\t';
          r->m_tables[0].m_code_size[0xfe] = '\t';
          r->m_tables[0].m_code_size[0xff] = '\t';
          *(undefined1 (*) [16])(r->m_tables[0].m_code_size + 0x100) = _DAT_0011d190;
          r->m_tables[0].m_code_size[0x110] = '\a';
          r->m_tables[0].m_code_size[0x111] = '\a';
          r->m_tables[0].m_code_size[0x112] = '\a';
          r->m_tables[0].m_code_size[0x113] = '\a';
          r->m_tables[0].m_code_size[0x114] = '\a';
          r->m_tables[0].m_code_size[0x115] = '\a';
          r->m_tables[0].m_code_size[0x116] = '\a';
          r->m_tables[0].m_code_size[0x117] = '\a';
          r->m_tables[0].m_code_size[0x118] = '\b';
          r->m_tables[0].m_code_size[0x119] = '\b';
          r->m_tables[0].m_code_size[0x11a] = '\b';
          r->m_tables[0].m_code_size[0x11b] = '\b';
          r->m_tables[0].m_code_size[0x11c] = '\b';
          r->m_tables[0].m_code_size[0x11d] = '\b';
          r->m_tables[0].m_code_size[0x11e] = '\b';
          r->m_tables[0].m_code_size[0x11f] = '\b';
          uVar20 = 1;
        }
        else {
          uVar25 = 0;
          if (uVar20 == 3) {
            uVar20 = 10;
            goto LAB_0011684f;
          }
          while (uVar20 = (uint)uVar25, uVar20 < 3) {
            bVar15 = "\x05\x05\x04"[uVar25];
            uVar21 = (uint)(char)bVar15;
            if (uVar30 < uVar21) {
              do {
                if (local_140 < puVar1) {
LAB_00116b0f:
                  uVar35 = (ulong)(byte)*local_140;
                  local_140 = (uint *)((long)local_140 + 1);
                }
                else {
LAB_001175b0:
                  uVar17 = (uint)uVar25;
                  uVar35 = 0;
                  uVar29 = 0;
                  if ((decomp_flags & 2) != 0) {
                    local_16c = TINFL_STATUS_NEEDS_MORE_INPUT;
                    cVar24 = '\x01';
                    uVar20 = 0xb;
                    goto LAB_00116851;
                  }
                }
                uVar18 = uVar18 | uVar35 << ((byte)uVar30 & 0x3f);
                uVar30 = uVar30 + 8;
                bVar15 = "\x05\x05\x04"[uVar25];
                uVar21 = (uint)(char)bVar15;
                uVar20 = (uint)uVar25;
              } while (uVar30 < uVar21);
            }
            uVar30 = uVar30 - uVar21;
            r->m_table_sizes[uVar25] =
                 ((uint)uVar18 & ~(-1 << (bVar15 & 0x1f))) +
                 tinfl_decompress::s_min_table_sizes[uVar25];
            uVar18 = uVar18 >> ((byte)uVar21 & 0x3f);
            uVar25 = (ulong)(uVar20 + 1);
          }
          memset(r->m_tables + 2,0,0x120);
          uVar35 = 0;
          while (uVar25 = uVar35, (uint)uVar35 < r->m_table_sizes[2]) {
            for (; uVar30 < 3; uVar30 = uVar30 + 8) {
              if (local_140 < puVar1) {
LAB_00116a71:
                uVar35 = (ulong)(byte)*local_140;
                local_140 = (uint *)((long)local_140 + 1);
              }
              else {
LAB_00117650:
                uVar17 = (uint)uVar25;
                uVar35 = 0;
                uVar29 = 0;
                if ((decomp_flags & 2) != 0) {
                  local_16c = TINFL_STATUS_NEEDS_MORE_INPUT;
                  cVar24 = '\x01';
                  uVar20 = 0xe;
                  goto LAB_00116851;
                }
              }
              uVar18 = uVar18 | uVar35 << ((byte)uVar30 & 0x3f);
            }
            bVar15 = (byte)uVar18;
            uVar18 = uVar18 >> 3;
            uVar30 = uVar30 - 3;
            r->m_tables[2].m_code_size["\x10\x11\x12"[uVar25]] = bVar15 & 7;
            uVar35 = (ulong)((int)uVar25 + 1);
          }
          r->m_table_sizes[2] = 0x13;
          uVar20 = r->m_type;
        }
        while (uVar17 = (uint)uVar35, -1 < (int)uVar20) {
          local_88 = (undefined1  [16])0x0;
          local_98 = (undefined1  [16])0x0;
          local_a8 = (undefined1  [16])0x0;
          local_b8 = (undefined1  [16])0x0;
          __s = r->m_tables[uVar20].m_look_up;
          iVar31 = 0;
          memset(__s,0,0xc80);
          auVar14 = _DAT_0011ca70;
          auVar13 = _DAT_0011ca50;
          auVar12 = _DAT_0011ca40;
          auVar11 = _DAT_0011ca30;
          auVar10 = _DAT_0011ca20;
          uVar25 = (ulong)r->m_table_sizes[uVar20];
          if (uVar25 != 0) {
            uVar29 = 0;
            do {
              *(int *)(local_b8 + (ulong)r->m_tables[uVar20].m_code_size[uVar29] * 4) =
                   *(int *)(local_b8 + (ulong)r->m_tables[uVar20].m_code_size[uVar29] * 4) + 1;
              uVar29 = uVar29 + 1;
            } while (uVar25 != uVar29);
          }
          local_78 = 0;
          lVar45 = 0;
          uVar21 = 0;
          do {
            uVar21 = uVar21 + *(int *)(local_b8 + lVar45 * 4 + 4);
            iVar31 = (iVar31 + *(int *)(local_b8 + lVar45 * 4 + 4)) * 2;
            aiStack_70[lVar45] = iVar31;
            lVar45 = lVar45 + 1;
          } while (lVar45 != 0xf);
          if (iVar31 != 0x10000 && 1 < uVar21) {
            uVar20 = 0x23;
LAB_00117dfc:
            uVar29 = 0;
            cVar24 = '\0';
            goto LAB_00116851;
          }
          if (uVar25 != 0) {
            uVar21 = 0xffffffff;
            uVar29 = 0;
            do {
              bVar15 = r->m_tables[uVar20].m_code_size[uVar29];
              uVar38 = (ulong)bVar15;
              if (bVar15 != 0) {
                uVar44 = *(uint *)((long)&local_78 + uVar38 * 4);
                *(uint *)((long)&local_78 + uVar38 * 4) = uVar44 + 1;
                uVar46 = (uint)bVar15;
                uVar17 = 0;
                do {
                  uVar34 = uVar17;
                  uVar16 = uVar44 & 1;
                  uVar17 = uVar16 + uVar34 * 2;
                  uVar44 = uVar44 >> 1;
                  uVar46 = uVar46 - 1;
                } while (uVar46 != 0);
                uVar34 = uVar34 * 2;
                if (bVar15 < 0xb) {
                  if (uVar34 < 0x400) {
                    lVar45 = 1L << (bVar15 & 0x3f);
                    uVar39 = (ushort)uVar29 | (ushort)bVar15 << 9;
                    uVar34 = uVar34 | uVar16;
                    uVar17 = uVar34 + (int)lVar45;
                    uVar47 = (ulong)uVar17;
                    uVar37 = (ulong)(uVar17 < 0x400);
                    uVar38 = 0x400;
                    if (0x400 < uVar47) {
                      uVar38 = uVar47;
                    }
                    uVar47 = (uVar38 - uVar37) - uVar47 >> (bVar15 & 0x3f);
                    lVar36 = uVar37 + uVar47;
                    auVar49._8_4_ = (int)lVar36;
                    auVar49._0_8_ = lVar36;
                    auVar49._12_4_ = (int)((ulong)lVar36 >> 0x20);
                    auVar49 = auVar49 ^ auVar14;
                    uVar38 = 0;
                    do {
                      lVar36 = (uVar38 << (bVar15 & 0x3f)) + (ulong)uVar34;
                      auVar59._8_4_ = (int)uVar38;
                      auVar59._0_8_ = uVar38;
                      auVar59._12_4_ = (int)(uVar38 >> 0x20);
                      auVar51 = (auVar59 | auVar13) ^ auVar14;
                      iVar31 = auVar49._0_4_;
                      iVar41 = -(uint)(iVar31 < auVar51._0_4_);
                      iVar32 = auVar49._4_4_;
                      auVar52._4_4_ = -(uint)(iVar32 < auVar51._4_4_);
                      iVar33 = auVar49._8_4_;
                      iVar42 = -(uint)(iVar33 < auVar51._8_4_);
                      iVar40 = auVar49._12_4_;
                      auVar52._12_4_ = -(uint)(iVar40 < auVar51._12_4_);
                      auVar61._4_4_ = iVar41;
                      auVar61._0_4_ = iVar41;
                      auVar61._8_4_ = iVar42;
                      auVar61._12_4_ = iVar42;
                      auVar65 = pshuflw(in_XMM11,auVar61,0xe8);
                      auVar54._4_4_ = -(uint)(auVar51._4_4_ == iVar32);
                      auVar54._12_4_ = -(uint)(auVar51._12_4_ == iVar40);
                      auVar54._0_4_ = auVar54._4_4_;
                      auVar54._8_4_ = auVar54._12_4_;
                      auVar67 = pshuflw(in_XMM12,auVar54,0xe8);
                      auVar52._0_4_ = auVar52._4_4_;
                      auVar52._8_4_ = auVar52._12_4_;
                      auVar66 = pshuflw(auVar65,auVar52,0xe8);
                      auVar51._8_4_ = 0xffffffff;
                      auVar51._0_8_ = 0xffffffffffffffff;
                      auVar51._12_4_ = 0xffffffff;
                      auVar51 = (auVar66 | auVar67 & auVar65) ^ auVar51;
                      auVar51 = packssdw(auVar51,auVar51);
                      if ((auVar51 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        __s[lVar36] = uVar39;
                      }
                      auVar52 = auVar54 & auVar61 | auVar52;
                      auVar51 = packssdw(auVar52,auVar52);
                      auVar66._8_4_ = 0xffffffff;
                      auVar66._0_8_ = 0xffffffffffffffff;
                      auVar66._12_4_ = 0xffffffff;
                      auVar51 = packssdw(auVar51 ^ auVar66,auVar51 ^ auVar66);
                      if ((auVar51._0_4_ >> 0x10 & 1) != 0) {
                        __s[lVar45 + lVar36] = uVar39;
                      }
                      auVar51 = (auVar59 | auVar12) ^ auVar14;
                      iVar41 = -(uint)(iVar31 < auVar51._0_4_);
                      auVar64._4_4_ = -(uint)(iVar32 < auVar51._4_4_);
                      iVar42 = -(uint)(iVar33 < auVar51._8_4_);
                      auVar64._12_4_ = -(uint)(iVar40 < auVar51._12_4_);
                      auVar53._4_4_ = iVar41;
                      auVar53._0_4_ = iVar41;
                      auVar53._8_4_ = iVar42;
                      auVar53._12_4_ = iVar42;
                      auVar60._4_4_ = -(uint)(auVar51._4_4_ == iVar32);
                      auVar60._12_4_ = -(uint)(auVar51._12_4_ == iVar40);
                      auVar60._0_4_ = auVar60._4_4_;
                      auVar60._8_4_ = auVar60._12_4_;
                      auVar64._0_4_ = auVar64._4_4_;
                      auVar64._8_4_ = auVar64._12_4_;
                      auVar51 = auVar60 & auVar53 | auVar64;
                      auVar51 = packssdw(auVar51,auVar51);
                      auVar4._8_4_ = 0xffffffff;
                      auVar4._0_8_ = 0xffffffffffffffff;
                      auVar4._12_4_ = 0xffffffff;
                      auVar51 = packssdw(auVar51 ^ auVar4,auVar51 ^ auVar4);
                      if ((auVar51 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        __s[lVar45 * 2 + lVar36] = uVar39;
                      }
                      auVar54 = pshufhw(auVar53,auVar53,0x84);
                      auVar61 = pshufhw(auVar60,auVar60,0x84);
                      auVar52 = pshufhw(auVar54,auVar64,0x84);
                      auVar55._8_4_ = 0xffffffff;
                      auVar55._0_8_ = 0xffffffffffffffff;
                      auVar55._12_4_ = 0xffffffff;
                      auVar55 = (auVar52 | auVar61 & auVar54) ^ auVar55;
                      auVar54 = packssdw(auVar55,auVar55);
                      if ((auVar54 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        __s[(3L << (bVar15 & 0x3f)) + lVar36] = uVar39;
                      }
                      auVar54 = (auVar59 | auVar11) ^ auVar14;
                      iVar41 = -(uint)(iVar31 < auVar54._0_4_);
                      auVar57._4_4_ = -(uint)(iVar32 < auVar54._4_4_);
                      iVar42 = -(uint)(iVar33 < auVar54._8_4_);
                      auVar57._12_4_ = -(uint)(iVar40 < auVar54._12_4_);
                      auVar62._4_4_ = iVar41;
                      auVar62._0_4_ = iVar41;
                      auVar62._8_4_ = iVar42;
                      auVar62._12_4_ = iVar42;
                      auVar51 = pshuflw(auVar51,auVar62,0xe8);
                      auVar56._4_4_ = -(uint)(auVar54._4_4_ == iVar32);
                      auVar56._12_4_ = -(uint)(auVar54._12_4_ == iVar40);
                      auVar56._0_4_ = auVar56._4_4_;
                      auVar56._8_4_ = auVar56._12_4_;
                      in_XMM12 = pshuflw(auVar67 & auVar65,auVar56,0xe8);
                      in_XMM12 = in_XMM12 & auVar51;
                      auVar57._0_4_ = auVar57._4_4_;
                      auVar57._8_4_ = auVar57._12_4_;
                      auVar51 = pshuflw(auVar51,auVar57,0xe8);
                      auVar65._8_4_ = 0xffffffff;
                      auVar65._0_8_ = 0xffffffffffffffff;
                      auVar65._12_4_ = 0xffffffff;
                      auVar65 = (auVar51 | in_XMM12) ^ auVar65;
                      in_XMM11 = packssdw(auVar65,auVar65);
                      if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        __s[lVar45 * 4 + lVar36] = uVar39;
                      }
                      auVar57 = auVar56 & auVar62 | auVar57;
                      auVar51 = packssdw(auVar57,auVar57);
                      auVar67._8_4_ = 0xffffffff;
                      auVar67._0_8_ = 0xffffffffffffffff;
                      auVar67._12_4_ = 0xffffffff;
                      auVar51 = packssdw(auVar51 ^ auVar67,auVar51 ^ auVar67);
                      if ((auVar51 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                        __s[(5L << (bVar15 & 0x3f)) + lVar36] = uVar39;
                      }
                      auVar51 = (auVar59 | auVar10) ^ auVar14;
                      iVar31 = -(uint)(iVar31 < auVar51._0_4_);
                      auVar63._4_4_ = -(uint)(iVar32 < auVar51._4_4_);
                      iVar33 = -(uint)(iVar33 < auVar51._8_4_);
                      auVar63._12_4_ = -(uint)(iVar40 < auVar51._12_4_);
                      auVar58._4_4_ = iVar31;
                      auVar58._0_4_ = iVar31;
                      auVar58._8_4_ = iVar33;
                      auVar58._12_4_ = iVar33;
                      auVar50._4_4_ = -(uint)(auVar51._4_4_ == iVar32);
                      auVar50._12_4_ = -(uint)(auVar51._12_4_ == iVar40);
                      auVar50._0_4_ = auVar50._4_4_;
                      auVar50._8_4_ = auVar50._12_4_;
                      auVar63._0_4_ = auVar63._4_4_;
                      auVar63._8_4_ = auVar63._12_4_;
                      auVar51 = auVar50 & auVar58 | auVar63;
                      auVar51 = packssdw(auVar51,auVar51);
                      auVar5._8_4_ = 0xffffffff;
                      auVar5._0_8_ = 0xffffffffffffffff;
                      auVar5._12_4_ = 0xffffffff;
                      auVar51 = packssdw(auVar51 ^ auVar5,auVar51 ^ auVar5);
                      if ((auVar51 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        __s[lVar36 + (6L << (bVar15 & 0x3f))] = uVar39;
                      }
                      auVar59 = pshufhw(auVar58,auVar58,0x84);
                      auVar51 = pshufhw(auVar50,auVar50,0x84);
                      auVar54 = pshufhw(auVar59,auVar63,0x84);
                      auVar6._8_4_ = 0xffffffff;
                      auVar6._0_8_ = 0xffffffffffffffff;
                      auVar6._12_4_ = 0xffffffff;
                      auVar51 = packssdw(auVar51 & auVar59,(auVar54 | auVar51 & auVar59) ^ auVar6);
                      if ((auVar51 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        __s[lVar36 + (7L << (bVar15 & 0x3f))] = uVar39;
                      }
                      uVar38 = uVar38 + 8;
                    } while ((uVar47 + uVar37 + 8 & 0xfffffffffffffff8) != uVar38);
                  }
                }
                else {
                  uVar17 = uVar17 & 0x3ff;
                  uVar44 = (uint)__s[uVar17];
                  if (__s[uVar17] == 0) {
                    __s[uVar17] = (mz_int16)uVar21;
                    uVar44 = uVar21;
                    uVar21 = uVar21 - 2;
                  }
                  uVar34 = uVar34 >> 9;
                  if (bVar15 != 0xb) {
                    do {
                      iVar31 = ~uVar44 + (uint)((uVar34 >> 1 & 1) != 0);
                      sVar2 = r->m_tables[uVar20].m_tree[iVar31];
                      uVar44 = (uint)sVar2;
                      if (sVar2 == 0) {
                        r->m_tables[uVar20].m_tree[iVar31] = (mz_int16)uVar21;
                        uVar44 = uVar21;
                        uVar21 = uVar21 - 2;
                      }
                      uVar34 = uVar34 >> 1;
                      uVar17 = (int)uVar38 - 1;
                      uVar38 = (ulong)uVar17;
                    } while (0xb < uVar17);
                  }
                  r->m_tables[uVar20].m_tree[(int)(~uVar44 + (uint)((uVar34 >> 1 & 1) != 0))] =
                       (ushort)uVar29;
                }
              }
              uVar29 = uVar29 + 1;
            } while (uVar29 != uVar25);
          }
          uVar29 = 0;
          if (uVar20 == 2) {
            while( true ) {
              uVar20 = r->m_table_sizes[0];
              uVar21 = r->m_table_sizes[1];
              uVar44 = uVar21 + uVar20;
              uVar17 = (uint)uVar29;
              if (uVar44 <= uVar17) break;
              uVar25 = uVar29;
              if (uVar30 < 0xf) {
                if ((long)puVar1 - (long)local_140 < 2) {
                  do {
                    uVar39 = r->m_tables[2].m_look_up[(uint)uVar18 & 0x3ff];
                    uVar20 = (uint)(short)uVar39;
                    if ((short)uVar39 < 0) {
                      if (10 < uVar30) {
                        uVar21 = 0xc;
                        do {
                          sVar2 = r->m_tables[2].m_tree
                                  [(long)(int)~uVar20 +
                                   (ulong)((uVar18 >> ((ulong)(uVar21 - 2) & 0x3f) & 1) != 0)];
                          uVar20 = (uint)sVar2;
                          if (-1 < sVar2) break;
                          bVar48 = uVar21 <= uVar30;
                          uVar21 = uVar21 + 1;
                        } while (bVar48);
                        if (-1 < sVar2) break;
                      }
                    }
                    else if ((0x1ff < uVar39) && (uVar20 >> 9 <= uVar30)) break;
                    if (local_140 < puVar1) {
LAB_00116bb4:
                      uVar35 = (ulong)(byte)*local_140;
                      local_140 = (uint *)((long)local_140 + 1);
                    }
                    else {
LAB_00117014:
                      uVar17 = (uint)uVar25;
                      uVar35 = 0;
                      if ((decomp_flags & 2) != 0) {
                        local_16c = TINFL_STATUS_NEEDS_MORE_INPUT;
                        cVar24 = '\x01';
                        uVar20 = 0x10;
                        goto LAB_00117de1;
                      }
                    }
                    uVar18 = uVar18 | uVar35 << ((byte)uVar30 & 0x3f);
                    uVar30 = uVar30 + 8;
                  } while (uVar30 < 0xf);
                }
                else {
                  uVar18 = uVar18 | (ulong)*(byte *)((long)local_140 + 1) <<
                                    ((byte)uVar30 + 8 & 0x3f) |
                                    (ulong)(byte)*local_140 << ((byte)uVar30 & 0x3f);
                  local_140 = (uint *)((long)local_140 + 2);
                  uVar30 = uVar30 | 0x10;
                }
              }
              uVar20 = (uint)r->m_tables[2].m_look_up[(uint)uVar18 & 0x3ff];
              local_148 = (ulong)uVar20;
              if ((int)uVar20 < 0) {
                uVar35 = 10;
                do {
                  uVar21 = (int)uVar35 + 1;
                  uVar20 = (uint)r->m_tables[2].m_tree
                                 [(long)(int)~(uint)local_148 +
                                  (ulong)((uVar18 >> (uVar35 & 0x3f) & 1) != 0)];
                  local_148 = (ulong)uVar20;
                  uVar35 = (ulong)uVar21;
                } while ((int)uVar20 < 0);
              }
              else {
                uVar21 = uVar20 >> 9;
                local_148 = (ulong)(uVar20 & 0x1ff);
              }
              uVar18 = uVar18 >> ((byte)uVar21 & 0x3f);
              uVar30 = uVar30 - uVar21;
              uVar20 = (uint)local_148;
              if (uVar20 < 0x10) {
                uVar29 = (ulong)((int)uVar25 + 1);
                r->m_len_codes[uVar25] = (mz_uint8)local_148;
              }
              else {
                if ((uVar20 == 0x10) && ((int)uVar25 == 0)) {
                  uVar17 = 0;
                  local_148 = 0x10;
                  uVar20 = 0x11;
                  cVar24 = '\0';
LAB_00117de1:
                  uVar29 = 0;
                  goto LAB_00116851;
                }
                uVar35 = (ulong)(uVar20 - 0x10);
                local_15c = (uint)"\x02\x03\a"[uVar35];
                if (uVar30 < local_15c) {
                  do {
                    if (local_140 < puVar1) {
LAB_00116cd0:
                      uVar35 = (ulong)(byte)*local_140;
                      local_140 = (uint *)((long)local_140 + 1);
                    }
                    else {
LAB_00117dad:
                      uVar17 = (uint)uVar25;
                      uVar35 = 0;
                      if ((decomp_flags & 2) != 0) {
                        local_16c = TINFL_STATUS_NEEDS_MORE_INPUT;
                        cVar24 = '\x01';
                        uVar20 = 0x12;
                        goto LAB_00117de1;
                      }
                    }
                    uVar18 = uVar35 << ((byte)uVar30 & 0x3f) | uVar18;
                    uVar30 = uVar30 + 8;
                  } while (uVar30 < local_15c);
                  uVar35 = (ulong)((int)local_148 - 0x10);
                }
                uVar20 = (uint)uVar18;
                uVar18 = uVar18 >> ((byte)local_15c & 0x3f);
                uVar30 = uVar30 - local_15c;
                uVar20 = (int)"\x03\x03\v"[uVar35] + (uVar20 & ~(-1 << ((byte)local_15c & 0x1f)));
                bVar15 = 0;
                if ((int)local_148 == 0x10) {
                  bVar15 = r->m_len_codes[(int)uVar25 - 1];
                }
                memset(r->m_len_codes + uVar25,(uint)bVar15,(ulong)uVar20);
                uVar29 = (ulong)((int)uVar25 + uVar20);
              }
            }
            if (uVar17 != uVar44) {
              uVar20 = 0x15;
              goto LAB_00117dfc;
            }
            memcpy(r->m_tables,r->m_len_codes,(ulong)uVar20);
            memcpy(r->m_tables + 1,r->m_len_codes + uVar20,(ulong)uVar21);
            uVar20 = r->m_type;
            uVar35 = uVar29;
          }
          uVar20 = uVar20 - 1;
          r->m_type = uVar20;
        }
LAB_00117e15:
        while( true ) {
          bVar15 = (byte)uVar30;
          if ((3 < (long)puVar1 - (long)local_140) && (1 < (long)pmVar22 - (long)local_150)) break;
          if (uVar30 < 0xf) {
            if ((long)puVar1 - (long)local_140 < 2) {
              do {
                uVar39 = r->m_tables[0].m_look_up[(uint)uVar18 & 0x3ff];
                uVar20 = (uint)(short)uVar39;
                if ((short)uVar39 < 0) {
                  if (10 < uVar30) {
                    uVar21 = 0xc;
                    do {
                      sVar2 = r->m_tables[0].m_tree
                              [(long)(int)~uVar20 +
                               (ulong)((uVar18 >> ((ulong)(uVar21 - 2) & 0x3f) & 1) != 0)];
                      uVar20 = (uint)sVar2;
                      if (-1 < sVar2) break;
                      bVar48 = uVar21 <= uVar30;
                      uVar21 = uVar21 + 1;
                    } while (bVar48);
                    if (-1 < sVar2) break;
                  }
                }
                else if ((0x1ff < uVar39) && (uVar20 >> 9 <= uVar30)) break;
                uVar25 = uVar35;
                if (local_140 < puVar1) {
LAB_00116a98:
                  uVar38 = (ulong)(byte)*local_140;
                  local_140 = (uint *)((long)local_140 + 1);
                  uVar35 = uVar25;
                }
                else {
LAB_00117fb1:
                  uVar17 = (uint)uVar25;
                  uVar38 = 0;
                  uVar29 = 0;
                  uVar35 = uVar25;
                  if ((decomp_flags & 2) != 0) {
                    local_16c = TINFL_STATUS_NEEDS_MORE_INPUT;
                    cVar24 = '\x01';
                    uVar20 = 0x17;
                    goto LAB_00116851;
                  }
                }
                uVar18 = uVar18 | uVar38 << ((byte)uVar30 & 0x3f);
                uVar30 = uVar30 + 8;
              } while (uVar30 < 0xf);
            }
            else {
              uVar18 = uVar18 | (ulong)*(byte *)((long)local_140 + 1) << (bVar15 + 8 & 0x3f) |
                                (ulong)(byte)*local_140 << (bVar15 & 0x3f);
              local_140 = (uint *)((long)local_140 + 2);
              uVar30 = uVar30 | 0x10;
            }
          }
          uVar20 = (uint)r->m_tables[0].m_look_up[(uint)uVar18 & 0x3ff];
          uVar35 = (ulong)uVar20;
          if ((int)uVar20 < 0) {
            uVar25 = 10;
            do {
              uVar21 = (int)uVar25 + 1;
              uVar20 = (uint)r->m_tables[0].m_tree
                             [(long)(int)~(uint)uVar35 +
                              (ulong)((uVar18 >> (uVar25 & 0x3f) & 1) != 0)];
              uVar35 = (ulong)uVar20;
              uVar25 = (ulong)uVar21;
            } while ((int)uVar20 < 0);
          }
          else {
            uVar21 = uVar20 >> 9;
            uVar35 = (ulong)(uVar20 & 0x1ff);
          }
          uVar18 = uVar18 >> ((byte)uVar21 & 0x3f);
          uVar30 = uVar30 - uVar21;
          uVar20 = (uint)uVar35;
          if (0xff < uVar20) goto LAB_00118036;
LAB_00118077:
          uVar17 = (uint)uVar35;
          if (pmVar22 <= local_150) {
            local_16c = TINFL_STATUS_HAS_MORE_OUTPUT;
            uVar25 = 1;
            uVar20 = 0x18;
            goto LAB_0011684f;
          }
          *local_150 = (mz_uint8)uVar35;
          local_150 = local_150 + 1;
        }
        if (uVar30 < 0x1e) {
          uVar18 = uVar18 | (ulong)*local_140 << (bVar15 & 0x3f);
          local_140 = local_140 + 1;
          uVar30 = uVar30 | 0x20;
        }
        uVar20 = (uint)r->m_tables[0].m_look_up[(uint)uVar18 & 0x3ff];
        uVar35 = (ulong)uVar20;
        if ((int)uVar20 < 0) {
          uVar25 = 10;
          do {
            uVar20 = (int)uVar25 + 1;
            uVar21 = (uint)r->m_tables[0].m_tree
                           [(long)(int)~(uint)uVar35 + (ulong)((uVar18 >> (uVar25 & 0x3f) & 1) != 0)
                           ];
            uVar35 = (ulong)uVar21;
            uVar25 = (ulong)uVar20;
          } while ((int)uVar21 < 0);
        }
        else {
          uVar20 = uVar20 >> 9;
        }
        uVar18 = uVar18 >> ((byte)uVar20 & 0x3f);
        uVar30 = uVar30 - uVar20;
        uVar20 = (uint)uVar35;
        if ((uVar20 >> 8 & 1) == 0) {
          sVar2 = r->m_tables[0].m_look_up[(uint)uVar18 & 0x3ff];
          uVar20 = (uint)sVar2;
          if (sVar2 < 0) {
            uVar25 = 10;
            do {
              uVar21 = (int)uVar25 + 1;
              sVar2 = r->m_tables[0].m_tree
                      [(long)(int)~uVar20 + (ulong)((uVar18 >> (uVar25 & 0x3f) & 1) != 0)];
              uVar20 = (uint)sVar2;
              uVar25 = (ulong)uVar21;
            } while (sVar2 < 0);
          }
          else {
            uVar21 = uVar20 >> 9;
          }
          uVar18 = uVar18 >> ((byte)uVar21 & 0x3f);
          uVar30 = uVar30 - uVar21;
          *local_150 = (mz_uint8)uVar35;
          if ((uVar20 >> 8 & 1) == 0) {
            local_150[1] = (mz_uint8)uVar20;
            local_150 = local_150 + 2;
            goto LAB_00117e15;
          }
          local_150 = local_150 + 1;
        }
LAB_00118036:
        uVar35 = 0x100;
        if ((uVar20 & 0x1ff) != 0x100) {
          uVar35 = (ulong)((uVar20 & 0x1ff) - 0x101);
          uVar25 = (ulong)(uint)tinfl_decompress::s_length_base[uVar35];
          local_15c = 0;
          if (0xffffffffffffffeb < uVar35 - 0x1c) {
            local_15c = tinfl_decompress::s_length_extra[uVar35];
            uVar35 = uVar18;
            for (; uVar30 < local_15c; uVar30 = uVar30 + 8) {
              uVar18 = uVar35;
              if (local_140 < puVar1) {
LAB_00116ca7:
                uVar35 = (ulong)(byte)*local_140;
                local_140 = (uint *)((long)local_140 + 1);
              }
              else {
LAB_00117054:
                uVar17 = (uint)uVar25;
                uVar35 = 0;
                uVar29 = 0;
                if ((decomp_flags & 2) != 0) {
                  local_16c = TINFL_STATUS_NEEDS_MORE_INPUT;
                  cVar24 = '\x01';
                  uVar20 = 0x19;
                  goto LAB_00116851;
                }
              }
              uVar35 = uVar18 | uVar35 << ((byte)uVar30 & 0x3f);
            }
            uVar18 = uVar35 >> ((byte)local_15c & 0x3f);
            uVar30 = uVar30 - local_15c;
            uVar25 = (ulong)(((uint)uVar35 & ~(-1 << ((byte)local_15c & 0x1f))) + (int)uVar25);
          }
          if (uVar30 < 0xf) {
            if ((long)puVar1 - (long)local_140 < 2) {
              do {
                uVar39 = r->m_tables[1].m_look_up[(uint)uVar18 & 0x3ff];
                uVar20 = (uint)(short)uVar39;
                if ((short)uVar39 < 0) {
                  if (10 < uVar30) {
                    uVar21 = 0xc;
                    do {
                      sVar2 = r->m_tables[1].m_tree
                              [(long)(int)~uVar20 +
                               (ulong)((uVar18 >> ((ulong)(uVar21 - 2) & 0x3f) & 1) != 0)];
                      uVar20 = (uint)sVar2;
                      if (-1 < sVar2) break;
                      bVar48 = uVar21 <= uVar30;
                      uVar21 = uVar21 + 1;
                    } while (bVar48);
                    if (-1 < sVar2) break;
                  }
                }
                else if ((0x1ff < uVar39) && (uVar20 >> 9 <= uVar30)) break;
                if (local_140 < puVar1) {
LAB_00116c4f:
                  uVar35 = (ulong)(byte)*local_140;
                  local_140 = (uint *)((long)local_140 + 1);
                }
                else {
LAB_00118262:
                  uVar17 = (uint)uVar25;
                  uVar35 = 0;
                  uVar29 = 0;
                  if ((decomp_flags & 2) != 0) {
                    local_16c = TINFL_STATUS_NEEDS_MORE_INPUT;
                    cVar24 = '\x01';
                    uVar20 = 0x1a;
                    goto LAB_00116851;
                  }
                }
                uVar18 = uVar18 | uVar35 << ((byte)uVar30 & 0x3f);
                uVar30 = uVar30 + 8;
              } while (uVar30 < 0xf);
            }
            else {
              uVar18 = uVar18 | (ulong)*(byte *)((long)local_140 + 1) << ((byte)uVar30 + 8 & 0x3f) |
                                (ulong)(byte)*local_140 << ((byte)uVar30 & 0x3f);
              local_140 = (uint *)((long)local_140 + 2);
              uVar30 = uVar30 | 0x10;
            }
          }
          sVar2 = r->m_tables[1].m_look_up[(uint)uVar18 & 0x3ff];
          uVar20 = (uint)sVar2;
          if (sVar2 < 0) {
            uVar35 = 10;
            do {
              uVar21 = (int)uVar35 + 1;
              sVar2 = r->m_tables[1].m_tree
                      [(long)(int)~uVar20 + (ulong)((uVar18 >> (uVar35 & 0x3f) & 1) != 0)];
              uVar20 = (uint)sVar2;
              uVar35 = (ulong)uVar21;
            } while (sVar2 < 0);
          }
          else {
            uVar21 = uVar20 >> 9;
            uVar20 = uVar20 & 0x1ff;
          }
          uVar18 = uVar18 >> ((byte)uVar21 & 0x3f);
          uVar30 = uVar30 - uVar21;
          uVar35 = (ulong)uVar20;
          local_148 = (ulong)(uint)tinfl_decompress::s_dist_base[uVar35];
          local_15c = 0;
          if (0xffffffffffffffe5 < uVar35 - 0x1e) {
            local_15c = tinfl_decompress::s_dist_extra[uVar35];
            uVar35 = uVar18;
            for (; uVar30 < local_15c; uVar30 = uVar30 + 8) {
              uVar18 = uVar35;
              if (local_140 < puVar1) {
LAB_00116cf7:
                uVar35 = (ulong)(byte)*local_140;
                local_140 = (uint *)((long)local_140 + 1);
              }
              else {
LAB_0011831d:
                uVar17 = (uint)uVar25;
                uVar35 = 0;
                uVar29 = 0;
                if ((decomp_flags & 2) != 0) {
                  local_16c = TINFL_STATUS_NEEDS_MORE_INPUT;
                  cVar24 = '\x01';
                  uVar20 = 0x1b;
                  goto LAB_00116851;
                }
              }
              uVar35 = uVar18 | uVar35 << ((byte)uVar30 & 0x3f);
            }
            uVar18 = uVar35 >> ((byte)local_15c & 0x3f);
            uVar30 = uVar30 - local_15c;
            local_148 = (ulong)(((uint)uVar35 & ~(-1 << ((byte)local_15c & 0x1f))) + (int)local_148)
            ;
          }
          uVar17 = (uint)uVar25;
          local_120 = (long)local_150 - (long)pOut_buf_start;
          if (((decomp_flags & 4) != 0) && (local_120 < local_148)) {
            uVar25 = 0;
            uVar20 = 0x25;
            goto LAB_0011684f;
          }
          pmVar19 = pOut_buf_start + (local_120 - local_148 & uVar26);
          pmVar23 = pmVar19;
          if (pmVar19 < local_150) {
            pmVar23 = local_150;
          }
          if (pmVar22 < pmVar23 + uVar25) {
            while( true ) {
              uVar35 = 0xffffffff;
              iVar31 = (int)uVar25;
              uVar25 = (ulong)(iVar31 - 1);
              if (iVar31 == 0) break;
LAB_00116f41:
              uVar17 = (uint)uVar25;
              if (pmVar22 <= local_150) {
                local_16c = TINFL_STATUS_HAS_MORE_OUTPUT;
                cVar24 = '\x01';
                uVar20 = 0x35;
                uVar29 = 0;
                goto LAB_00116851;
              }
              *local_150 = pOut_buf_start[local_120 - local_148 & uVar26];
              local_150 = local_150 + 1;
              local_120 = local_120 + 1;
            }
          }
          else {
            uVar35 = (ulong)(uVar17 - 3) + 3;
            do {
              pmVar27 = local_150;
              pmVar23 = pmVar19;
              *pmVar27 = *pmVar23;
              pmVar27[1] = pmVar23[1];
              pmVar27[2] = pmVar23[2];
              local_150 = pmVar27 + 3;
              uVar35 = uVar35 - 3;
              iVar31 = (int)uVar35;
              pmVar19 = pmVar23 + 3;
            } while (2 < iVar31);
            if (0 < iVar31) {
              *local_150 = pmVar23[3];
              if (iVar31 == 2) {
                pmVar27[4] = pmVar23[4];
              }
              local_150 = local_150 + uVar35;
            }
          }
          goto LAB_00117e15;
        }
      }
      uVar17 = (uint)uVar35;
    } while ((r->m_final & 1) == 0);
    if ((decomp_flags & 1) != 0) {
LAB_00118062:
      uVar18 = uVar18 >> ((byte)uVar30 & 7);
      uVar25 = 0;
      uVar21 = uVar30 & 0xfffffff8;
      while (uVar17 = (uint)uVar25, uVar30 = uVar21, uVar17 < 4) {
        if (uVar21 == 0) {
          uVar30 = 0;
          if (local_140 < puVar1) {
            uVar20 = (uint)(byte)*local_140;
            local_140 = (uint *)((long)local_140 + 1);
            uVar30 = 0;
          }
          else {
LAB_0011814f:
            uVar29 = 0;
            uVar20 = 0;
            if ((decomp_flags & 2) != 0) {
              local_16c = TINFL_STATUS_NEEDS_MORE_INPUT;
              cVar24 = '\x01';
              uVar20 = 0x2a;
              goto LAB_00116851;
            }
          }
        }
        else {
          if (uVar21 < 8) {
            do {
              uVar17 = (uint)uVar25;
              if (local_140 < puVar1) {
                uVar20 = *local_140;
                local_140 = (uint *)((long)local_140 + 1);
                uVar18 = uVar18 | (ulong)(byte)uVar20 << ((byte)uVar30 & 0x3f);
                uVar21 = uVar30 + 8;
                break;
              }
LAB_001181a2:
              uVar17 = (uint)uVar25;
              uVar29 = 0;
              if ((decomp_flags & 2) != 0) {
                local_16c = TINFL_STATUS_NEEDS_MORE_INPUT;
                cVar24 = '\x01';
                uVar20 = 0x29;
                goto LAB_00116851;
              }
LAB_001181af:
              uVar17 = (uint)uVar25;
              uVar18 = uVar18 | uVar29 << ((byte)uVar30 & 0x3f);
              uVar21 = uVar30 + 8;
              bVar48 = 0xfffffff7 < uVar30;
              uVar30 = uVar21;
            } while (bVar48);
          }
          uVar20 = (uint)uVar18 & 0xff;
          uVar18 = uVar18 >> 8;
          uVar30 = uVar21 - 8;
        }
LAB_001181d1:
        r->m_z_adler32 = r->m_z_adler32 << 8 | uVar20;
        uVar21 = uVar30;
        uVar25 = (ulong)(uVar17 + 1);
      }
    }
    uVar20 = 0x22;
LAB_0011817f:
    local_16c = TINFL_STATUS_DONE;
    cVar24 = '\x01';
    uVar29 = 1;
    break;
  case 3:
    if ((long)sVar3 < 1) goto LAB_00117360;
    goto LAB_00116bed;
  default:
    goto switchD_00116849_caseD_4;
  case 5:
    if (0 < (long)sVar3) {
      uVar25 = (ulong)*pIn_buf_next;
      local_140 = (uint *)(pIn_buf_next + 1);
LAB_00116d82:
      uVar18 = uVar18 | uVar25 << ((byte)uVar30 & 0x3f);
      uVar30 = uVar30 + 8;
      goto LAB_00117158;
    }
    uVar25 = 0;
    if ((decomp_flags & 2) == 0) goto LAB_00116d82;
    uVar20 = 5;
LAB_00116f39:
    local_16c = TINFL_STATUS_NEEDS_MORE_INPUT;
    uVar29 = 0;
    cVar24 = '\x01';
    break;
  case 6:
    if ((long)sVar3 < 1) goto LAB_00117305;
    local_140 = (uint *)(pIn_buf_next + 1);
    uVar29 = (ulong)*pIn_buf_next;
    goto LAB_00117312;
  case 7:
    if ((long)sVar3 < 1) goto LAB_001172bd;
    local_140 = (uint *)(pIn_buf_next + 1);
    r->m_raw_header[uVar25] = *pIn_buf_next;
    goto LAB_0011733b;
  case 9:
    goto LAB_0011744a;
  case 10:
  case 0x11:
  case 0x15:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x27:
  case 0x28:
switchD_00116849_caseD_a:
    uVar25 = 0;
LAB_0011684f:
    cVar24 = (char)uVar25;
    uVar29 = 0;
    break;
  case 0xb:
    if ((long)sVar3 < 1) goto LAB_001175b0;
    goto LAB_00116b0f;
  case 0xe:
    if ((long)sVar3 < 1) goto LAB_00117650;
    goto LAB_00116a71;
  case 0x10:
    if ((long)sVar3 < 1) goto LAB_00117014;
    goto LAB_00116bb4;
  case 0x12:
    if ((long)sVar3 < 1) goto LAB_00117dad;
    goto LAB_00116cd0;
  case 0x17:
    if ((long)sVar3 < 1) goto LAB_00117fb1;
    goto LAB_00116a98;
  case 0x18:
    uVar35 = uVar25;
    goto LAB_00118077;
  case 0x19:
    if ((long)sVar3 < 1) goto LAB_00117054;
    goto LAB_00116ca7;
  case 0x1a:
    if ((long)sVar3 < 1) goto LAB_00118262;
    goto LAB_00116c4f;
  case 0x1b:
    if ((long)sVar3 < 1) goto LAB_0011831d;
    goto LAB_00116cf7;
  case 0x20:
    if ((long)sVar3 < 1) {
      uVar26 = 0;
      if ((decomp_flags & 2) != 0) {
        uVar20 = 0x20;
        goto LAB_00116f39;
      }
    }
    else {
      uVar26 = (ulong)*pIn_buf_next;
      local_140 = (uint *)(pIn_buf_next + 1);
    }
    uVar18 = uVar18 | uVar26 << ((byte)uVar30 & 0x3f);
    uVar30 = uVar30 + 8;
    goto LAB_00118062;
  case 0x22:
    goto LAB_0011817f;
  case 0x26:
    goto LAB_0011745a;
  case 0x29:
    if ((long)sVar3 < 1) goto LAB_001181a2;
    local_140 = (uint *)(pIn_buf_next + 1);
    uVar29 = (ulong)*pIn_buf_next;
    goto LAB_001181af;
  case 0x2a:
    if ((long)sVar3 < 1) goto LAB_0011814f;
    local_140 = (uint *)(pIn_buf_next + 1);
    uVar20 = (uint)*pIn_buf_next;
    goto LAB_001181d1;
  case 0x33:
    if ((long)sVar3 < 1) goto LAB_001173de;
    local_140 = (uint *)(pIn_buf_next + 1);
    uVar35 = (ulong)*pIn_buf_next;
    goto LAB_001173eb;
  case 0x34:
    goto LAB_0011740d;
  case 0x35:
    goto LAB_00116f41;
  }
LAB_00116851:
  cVar28 = (char)uVar29;
  uVar21 = (uint)local_148;
  r->m_state = uVar20;
LAB_00116854:
  r->m_num_bits = uVar30;
  r->m_bit_buf = uVar18;
  r->m_dist = uVar21;
  r->m_counter = uVar17;
  r->m_num_extra = local_15c;
  r->m_dist_from_out_buf_start = local_120;
  *pIn_buf_size = (long)local_140 - (long)pIn_buf_next;
  uVar26 = (long)local_150 - (long)pOut_buf_next;
  *pOut_buf_size = uVar26;
  if (cVar24 != '\0') {
    uVar30 = r->m_check_adler32 & 0xffff;
    uVar20 = r->m_check_adler32 >> 0x10;
    if (uVar26 != 0) {
      uVar18 = uVar26 % 0x15b0;
      do {
        uVar35 = 0;
        uVar25 = uVar35;
        if (7 < uVar18) {
          do {
            iVar40 = pOut_buf_next[uVar25] + uVar30;
            iVar31 = (uint)pOut_buf_next[uVar25 + 1] + iVar40;
            iVar41 = (uint)pOut_buf_next[uVar25 + 2] + iVar31;
            iVar32 = (uint)pOut_buf_next[uVar25 + 3] + iVar41;
            iVar42 = (uint)pOut_buf_next[uVar25 + 4] + iVar32;
            iVar33 = (uint)pOut_buf_next[uVar25 + 5] + iVar42;
            iVar43 = (uint)pOut_buf_next[uVar25 + 6] + iVar33;
            uVar30 = (uint)pOut_buf_next[uVar25 + 7] + iVar43;
            uVar20 = uVar20 + iVar40 + iVar31 + iVar41 + iVar32 + iVar42 + iVar33 + iVar43 + uVar30;
            uVar35 = uVar25 + 8;
            iVar31 = (int)uVar25;
            uVar25 = uVar35;
          } while (iVar31 + 0xfU < (uint)uVar18);
          pOut_buf_next = pOut_buf_next + uVar35;
        }
        lVar45 = uVar18 - uVar35;
        if (uVar35 <= uVar18 && lVar45 != 0) {
          lVar36 = 0;
          do {
            uVar30 = uVar30 + pOut_buf_next[lVar36];
            uVar20 = uVar20 + uVar30;
            lVar36 = lVar36 + 1;
          } while (lVar45 != lVar36);
          pOut_buf_next = pOut_buf_next + lVar45;
        }
        uVar30 = uVar30 % 0xfff1;
        uVar20 = uVar20 % 0xfff1;
        uVar26 = uVar26 - uVar18;
        uVar18 = 0x15b0;
      } while (uVar26 != 0);
    }
    uVar30 = uVar20 << 0x10 | uVar30;
    r->m_check_adler32 = uVar30;
    if ((cVar28 != '\0') && (local_16c = TINFL_STATUS_DONE, (decomp_flags & 1) != 0)) {
      local_16c = (uint)(uVar30 == r->m_z_adler32) * 2 + TINFL_STATUS_ADLER32_MISMATCH;
    }
  }
  return local_16c;
}

Assistant:

static tinfl_status tinfl_decompress(tinfl_decompressor *r, const mz_uint8 *pIn_buf_next, size_t *pIn_buf_size, mz_uint8 *pOut_buf_start, mz_uint8 *pOut_buf_next, size_t *pOut_buf_size, const mz_uint32 decomp_flags)
{
  static const int s_length_base[31] = { 3,4,5,6,7,8,9,10,11,13, 15,17,19,23,27,31,35,43,51,59, 67,83,99,115,131,163,195,227,258,0,0 };
  static const int s_length_extra[31]= { 0,0,0,0,0,0,0,0,1,1,1,1,2,2,2,2,3,3,3,3,4,4,4,4,5,5,5,5,0,0,0 };
  static const int s_dist_base[32] = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193, 257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577,0,0};
  static const int s_dist_extra[32] = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13};
  static const mz_uint8 s_length_dezigzag[19] = { 16,17,18,0,8,7,9,6,10,5,11,4,12,3,13,2,14,1,15 };
  static const int s_min_table_sizes[3] = { 257, 1, 4 };

  tinfl_status status = TINFL_STATUS_FAILED; mz_uint32 num_bits, dist, counter, num_extra; tinfl_bit_buf_t bit_buf;
  const mz_uint8 *pIn_buf_cur = pIn_buf_next, *const pIn_buf_end = pIn_buf_next + *pIn_buf_size;
  mz_uint8 *pOut_buf_cur = pOut_buf_next, *const pOut_buf_end = pOut_buf_next + *pOut_buf_size;
  size_t out_buf_size_mask = (decomp_flags & TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF) ? (size_t)-1 : ((pOut_buf_next - pOut_buf_start) + *pOut_buf_size) - 1, dist_from_out_buf_start;

  /* Ensure the output buffer's size is a power of 2, unless the output buffer is large enough to hold the entire output file (in which case it doesn't matter). */
  if (((out_buf_size_mask + 1) & out_buf_size_mask) || (pOut_buf_next < pOut_buf_start)) { *pIn_buf_size = *pOut_buf_size = 0; return TINFL_STATUS_BAD_PARAM; }

  num_bits = r->m_num_bits; bit_buf = r->m_bit_buf; dist = r->m_dist; counter = r->m_counter; num_extra = r->m_num_extra; dist_from_out_buf_start = r->m_dist_from_out_buf_start;
  TINFL_CR_BEGIN

  bit_buf = num_bits = dist = counter = num_extra = r->m_zhdr0 = r->m_zhdr1 = 0; r->m_z_adler32 = r->m_check_adler32 = 1;
  if (decomp_flags & TINFL_FLAG_PARSE_ZLIB_HEADER)
  {
    TINFL_GET_BYTE(1, r->m_zhdr0); TINFL_GET_BYTE(2, r->m_zhdr1);
    counter = (((r->m_zhdr0 * 256 + r->m_zhdr1) % 31 != 0) || (r->m_zhdr1 & 32) || ((r->m_zhdr0 & 15) != 8));
    if (!(decomp_flags & TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF)) counter |= (((1U << (8U + (r->m_zhdr0 >> 4))) > 32768U) || ((out_buf_size_mask + 1) < (size_t)(1U << (8U + (r->m_zhdr0 >> 4)))));
    if (counter) { TINFL_CR_RETURN_FOREVER(36, TINFL_STATUS_FAILED); }
  }

  do
  {
    TINFL_GET_BITS(3, r->m_final, 3); r->m_type = r->m_final >> 1;
    if (r->m_type == 0)
    {
      TINFL_SKIP_BITS(5, num_bits & 7);
      for (counter = 0; counter < 4; ++counter) { if (num_bits) TINFL_GET_BITS(6, r->m_raw_header[counter], 8); else TINFL_GET_BYTE(7, r->m_raw_header[counter]); }
      if ((counter = (r->m_raw_header[0] | (r->m_raw_header[1] << 8))) != (mz_uint)(0xFFFF ^ (r->m_raw_header[2] | (r->m_raw_header[3] << 8)))) { TINFL_CR_RETURN_FOREVER(39, TINFL_STATUS_FAILED); }
      while ((counter) && (num_bits))
      {
        TINFL_GET_BITS(51, dist, 8);
        while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(52, TINFL_STATUS_HAS_MORE_OUTPUT); }
        *pOut_buf_cur++ = (mz_uint8)dist;
        counter--;
      }
      while (counter)
      {
        size_t n; while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(9, TINFL_STATUS_HAS_MORE_OUTPUT); }
        while (pIn_buf_cur >= pIn_buf_end)
        {
          if (decomp_flags & TINFL_FLAG_HAS_MORE_INPUT)
          {
            TINFL_CR_RETURN(38, TINFL_STATUS_NEEDS_MORE_INPUT);
          }
          else
          {
            TINFL_CR_RETURN_FOREVER(40, TINFL_STATUS_FAILED);
          }
        }
        n = MZ_MIN(MZ_MIN((size_t)(pOut_buf_end - pOut_buf_cur), (size_t)(pIn_buf_end - pIn_buf_cur)), counter);
        TINFL_MEMCPY(pOut_buf_cur, pIn_buf_cur, n); pIn_buf_cur += n; pOut_buf_cur += n; counter -= (mz_uint)n;
      }
    }
    else if (r->m_type == 3)
    {
      TINFL_CR_RETURN_FOREVER(10, TINFL_STATUS_FAILED);
    }
    else
    {
      if (r->m_type == 1)
      {
        mz_uint8 *p = r->m_tables[0].m_code_size; mz_uint i;
        r->m_table_sizes[0] = 288; r->m_table_sizes[1] = 32; TINFL_MEMSET(r->m_tables[1].m_code_size, 5, 32);
        for ( i = 0; i <= 143; ++i) *p++ = 8;
        for ( ; i <= 255; ++i) *p++ = 9;
        for ( ; i <= 279; ++i) *p++ = 7;
        for ( ; i <= 287; ++i) *p++ = 8;
      }
      else
      {
        for (counter = 0; counter < 3; counter++) { TINFL_GET_BITS(11, r->m_table_sizes[counter], "\05\05\04"[counter]); r->m_table_sizes[counter] += s_min_table_sizes[counter]; }
        MZ_CLEAR_OBJ(r->m_tables[2].m_code_size); for (counter = 0; counter < r->m_table_sizes[2]; counter++) { mz_uint s; TINFL_GET_BITS(14, s, 3); r->m_tables[2].m_code_size[s_length_dezigzag[counter]] = (mz_uint8)s; }
        r->m_table_sizes[2] = 19;
      }
      for ( ; (int)r->m_type >= 0; r->m_type--)
      {
        int tree_next, tree_cur; tinfl_huff_table *pTable;
        mz_uint i, j, used_syms, total, sym_index, next_code[17], total_syms[16]; pTable = &r->m_tables[r->m_type]; MZ_CLEAR_OBJ(total_syms); MZ_CLEAR_OBJ(pTable->m_look_up); MZ_CLEAR_OBJ(pTable->m_tree);
        for (i = 0; i < r->m_table_sizes[r->m_type]; ++i) total_syms[pTable->m_code_size[i]]++;
        used_syms = 0, total = 0; next_code[0] = next_code[1] = 0;
        for (i = 1; i <= 15; ++i) { used_syms += total_syms[i]; next_code[i + 1] = (total = ((total + total_syms[i]) << 1)); }
        if ((65536 != total) && (used_syms > 1))
        {
          TINFL_CR_RETURN_FOREVER(35, TINFL_STATUS_FAILED);
        }
        for (tree_next = -1, sym_index = 0; sym_index < r->m_table_sizes[r->m_type]; ++sym_index)
        {
          mz_uint rev_code = 0, l, cur_code, code_size = pTable->m_code_size[sym_index]; if (!code_size) continue;
          cur_code = next_code[code_size]++; for (l = code_size; l > 0; l--, cur_code >>= 1) rev_code = (rev_code << 1) | (cur_code & 1);
          if (code_size <= TINFL_FAST_LOOKUP_BITS) { mz_int16 k = (mz_int16)((code_size << 9) | sym_index); while (rev_code < TINFL_FAST_LOOKUP_SIZE) { pTable->m_look_up[rev_code] = k; rev_code += (1 << code_size); } continue; }
          if (0 == (tree_cur = pTable->m_look_up[rev_code & (TINFL_FAST_LOOKUP_SIZE - 1)])) { pTable->m_look_up[rev_code & (TINFL_FAST_LOOKUP_SIZE - 1)] = (mz_int16)tree_next; tree_cur = tree_next; tree_next -= 2; }
          rev_code >>= (TINFL_FAST_LOOKUP_BITS - 1);
          for (j = code_size; j > (TINFL_FAST_LOOKUP_BITS + 1); j--)
          {
            tree_cur -= ((rev_code >>= 1) & 1);
            if (!pTable->m_tree[-tree_cur - 1]) { pTable->m_tree[-tree_cur - 1] = (mz_int16)tree_next; tree_cur = tree_next; tree_next -= 2; } else tree_cur = pTable->m_tree[-tree_cur - 1];
          }
          tree_cur -= ((rev_code >>= 1) & 1); pTable->m_tree[-tree_cur - 1] = (mz_int16)sym_index;
        }
        if (r->m_type == 2)
        {
          for (counter = 0; counter < (r->m_table_sizes[0] + r->m_table_sizes[1]); )
          {
            mz_uint s; TINFL_HUFF_DECODE(16, dist, &r->m_tables[2]); if (dist < 16) { r->m_len_codes[counter++] = (mz_uint8)dist; continue; }
            if ((dist == 16) && (!counter))
            {
              TINFL_CR_RETURN_FOREVER(17, TINFL_STATUS_FAILED);
            }
            num_extra = "\02\03\07"[dist - 16]; TINFL_GET_BITS(18, s, num_extra); s += "\03\03\013"[dist - 16];
            TINFL_MEMSET(r->m_len_codes + counter, (dist == 16) ? r->m_len_codes[counter - 1] : 0, s); counter += s;
          }
          if ((r->m_table_sizes[0] + r->m_table_sizes[1]) != counter)
          {
            TINFL_CR_RETURN_FOREVER(21, TINFL_STATUS_FAILED);
          }
          TINFL_MEMCPY(r->m_tables[0].m_code_size, r->m_len_codes, r->m_table_sizes[0]); TINFL_MEMCPY(r->m_tables[1].m_code_size, r->m_len_codes + r->m_table_sizes[0], r->m_table_sizes[1]);
        }
      }
      for ( ; ; )
      {
        mz_uint8 *pSrc;
        for ( ; ; )
        {
          if (((pIn_buf_end - pIn_buf_cur) < 4) || ((pOut_buf_end - pOut_buf_cur) < 2))
          {
            TINFL_HUFF_DECODE(23, counter, &r->m_tables[0]);
            if (counter >= 256)
              break;
            while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(24, TINFL_STATUS_HAS_MORE_OUTPUT); }
            *pOut_buf_cur++ = (mz_uint8)counter;
          }
          else
          {
            int sym2; mz_uint code_len;
#if TINFL_USE_64BIT_BITBUF
            if (num_bits < 30) { bit_buf |= (((tinfl_bit_buf_t)MZ_READ_LE32(pIn_buf_cur)) << num_bits); pIn_buf_cur += 4; num_bits += 32; }
#else
            if (num_bits < 15) { bit_buf |= (((tinfl_bit_buf_t)MZ_READ_LE16(pIn_buf_cur)) << num_bits); pIn_buf_cur += 2; num_bits += 16; }
#endif
            if ((sym2 = r->m_tables[0].m_look_up[bit_buf & (TINFL_FAST_LOOKUP_SIZE - 1)]) >= 0)
              code_len = sym2 >> 9;
            else
            {
              code_len = TINFL_FAST_LOOKUP_BITS; do { sym2 = r->m_tables[0].m_tree[~sym2 + ((bit_buf >> code_len++) & 1)]; } while (sym2 < 0);
            }
            counter = sym2; bit_buf >>= code_len; num_bits -= code_len;
            if (counter & 256)
              break;

#if !TINFL_USE_64BIT_BITBUF
            if (num_bits < 15) { bit_buf |= (((tinfl_bit_buf_t)MZ_READ_LE16(pIn_buf_cur)) << num_bits); pIn_buf_cur += 2; num_bits += 16; }
#endif
            if ((sym2 = r->m_tables[0].m_look_up[bit_buf & (TINFL_FAST_LOOKUP_SIZE - 1)]) >= 0)
              code_len = sym2 >> 9;
            else
            {
              code_len = TINFL_FAST_LOOKUP_BITS; do { sym2 = r->m_tables[0].m_tree[~sym2 + ((bit_buf >> code_len++) & 1)]; } while (sym2 < 0);
            }
            bit_buf >>= code_len; num_bits -= code_len;

            pOut_buf_cur[0] = (mz_uint8)counter;
            if (sym2 & 256)
            {
              pOut_buf_cur++;
              counter = sym2;
              break;
            }
            pOut_buf_cur[1] = (mz_uint8)sym2;
            pOut_buf_cur += 2;
          }
        }
        if ((counter &= 511) == 256) break;

        num_extra = s_length_extra[counter - 257]; counter = s_length_base[counter - 257];
        if (num_extra) { mz_uint extra_bits; TINFL_GET_BITS(25, extra_bits, num_extra); counter += extra_bits; }

        TINFL_HUFF_DECODE(26, dist, &r->m_tables[1]);
        num_extra = s_dist_extra[dist]; dist = s_dist_base[dist];
        if (num_extra) { mz_uint extra_bits; TINFL_GET_BITS(27, extra_bits, num_extra); dist += extra_bits; }

        dist_from_out_buf_start = pOut_buf_cur - pOut_buf_start;
        if ((dist > dist_from_out_buf_start) && (decomp_flags & TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF))
        {
          TINFL_CR_RETURN_FOREVER(37, TINFL_STATUS_FAILED);
        }

        pSrc = pOut_buf_start + ((dist_from_out_buf_start - dist) & out_buf_size_mask);

        if ((MZ_MAX(pOut_buf_cur, pSrc) + counter) > pOut_buf_end)
        {
          while (counter--)
          {
            while (pOut_buf_cur >= pOut_buf_end) { TINFL_CR_RETURN(53, TINFL_STATUS_HAS_MORE_OUTPUT); }
            *pOut_buf_cur++ = pOut_buf_start[(dist_from_out_buf_start++ - dist) & out_buf_size_mask];
          }
          continue;
        }
#if MINIZ_USE_UNALIGNED_LOADS_AND_STORES
        else if ((counter >= 9) && (counter <= dist))
        {
          const mz_uint8 *pSrc_end = pSrc + (counter & ~7);
          do
          {
            ((mz_uint32 *)pOut_buf_cur)[0] = ((const mz_uint32 *)pSrc)[0];
            ((mz_uint32 *)pOut_buf_cur)[1] = ((const mz_uint32 *)pSrc)[1];
            pOut_buf_cur += 8;
          } while ((pSrc += 8) < pSrc_end);
          if ((counter &= 7) < 3)
          {
            if (counter)
            {
              pOut_buf_cur[0] = pSrc[0];
              if (counter > 1)
                pOut_buf_cur[1] = pSrc[1];
              pOut_buf_cur += counter;
            }
            continue;
          }
        }
#endif
        do
        {
          pOut_buf_cur[0] = pSrc[0];
          pOut_buf_cur[1] = pSrc[1];
          pOut_buf_cur[2] = pSrc[2];
          pOut_buf_cur += 3; pSrc += 3;
        } while ((int)(counter -= 3) > 2);
        if ((int)counter > 0)
        {
          pOut_buf_cur[0] = pSrc[0];
          if ((int)counter > 1)
            pOut_buf_cur[1] = pSrc[1];
          pOut_buf_cur += counter;
        }
      }
    }
  } while (!(r->m_final & 1));
  if (decomp_flags & TINFL_FLAG_PARSE_ZLIB_HEADER)
  {
    TINFL_SKIP_BITS(32, num_bits & 7); for (counter = 0; counter < 4; ++counter) { mz_uint s; if (num_bits) TINFL_GET_BITS(41, s, 8); else TINFL_GET_BYTE(42, s); r->m_z_adler32 = (r->m_z_adler32 << 8) | s; }
  }
  TINFL_CR_RETURN_FOREVER(34, TINFL_STATUS_DONE);
  TINFL_CR_FINISH

common_exit:
  r->m_num_bits = num_bits; r->m_bit_buf = bit_buf; r->m_dist = dist; r->m_counter = counter; r->m_num_extra = num_extra; r->m_dist_from_out_buf_start = dist_from_out_buf_start;
  *pIn_buf_size = pIn_buf_cur - pIn_buf_next; *pOut_buf_size = pOut_buf_cur - pOut_buf_next;
  if ((decomp_flags & (TINFL_FLAG_PARSE_ZLIB_HEADER | TINFL_FLAG_COMPUTE_ADLER32)) && (status >= 0))
  {
    const mz_uint8 *ptr = pOut_buf_next; size_t buf_len = *pOut_buf_size;
    mz_uint32 i, s1 = r->m_check_adler32 & 0xffff, s2 = r->m_check_adler32 >> 16; size_t block_len = buf_len % 5552;
    while (buf_len)
    {
      for (i = 0; i + 7 < block_len; i += 8, ptr += 8)
      {
        s1 += ptr[0], s2 += s1; s1 += ptr[1], s2 += s1; s1 += ptr[2], s2 += s1; s1 += ptr[3], s2 += s1;
        s1 += ptr[4], s2 += s1; s1 += ptr[5], s2 += s1; s1 += ptr[6], s2 += s1; s1 += ptr[7], s2 += s1;
      }
      for ( ; i < block_len; ++i) s1 += *ptr++, s2 += s1;
      s1 %= 65521U, s2 %= 65521U; buf_len -= block_len; block_len = 5552;
    }
    r->m_check_adler32 = (s2 << 16) + s1; if ((status == TINFL_STATUS_DONE) && (decomp_flags & TINFL_FLAG_PARSE_ZLIB_HEADER) && (r->m_check_adler32 != r->m_z_adler32)) status = TINFL_STATUS_ADLER32_MISMATCH;
  }
  return status;
}